

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

AREA_AFFECT_DATA * new_affect_area(void)

{
  AREA_AFFECT_DATA *pAVar1;
  
  if (aaffect_free == (AREA_AFFECT_DATA *)0x0) {
    pAVar1 = (AREA_AFFECT_DATA *)operator_new(0x50);
  }
  else {
    pAVar1 = aaffect_free;
    aaffect_free = aaffect_free->next;
  }
  pAVar1->valid = false;
  pAVar1->field_0x11 = 0;
  pAVar1->where = 0;
  pAVar1->type = 0;
  pAVar1->level = 0;
  pAVar1->duration = 0;
  pAVar1->location = 0;
  pAVar1->modifier = 0;
  *(undefined2 *)&pAVar1->field_0x1e = 0;
  pAVar1->tick_fun = (AAFF_FUN *)0x0;
  pAVar1->end_fun = (AAFF_FUN *)0x0;
  *(undefined8 *)&pAVar1->aftype = 0;
  pAVar1->pulse_fun = (AAFF_FUN *)0x0;
  pAVar1->bitvector[0] = 0;
  pAVar1->bitvector[1] = 0;
  pAVar1->next = (AREA_AFFECT_DATA *)0x0;
  pAVar1->owner = (CHAR_DATA *)0x0;
  pAVar1->valid = true;
  return pAVar1;
}

Assistant:

AREA_AFFECT_DATA *new_affect_area(void)
{
	static AREA_AFFECT_DATA af_zero;
	AREA_AFFECT_DATA *af;

	if (aaffect_free == nullptr)
	{
		af = new AREA_AFFECT_DATA;
	}
	else
	{
		af = aaffect_free;
		aaffect_free = aaffect_free->next;
	}

	*af = af_zero;

	af->valid = true;
	return af;
}